

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O1

int CRYPTO_pkcs7_unpad(uint *unpadded_buflen_p,uchar *buf,uint blocksize)

{
  ulong uVar1;
  uint uVar2;
  byte *pbVar3;
  ulong uVar4;
  byte bVar5;
  uint uVar6;
  bool bVar7;
  
  uVar2 = 0;
  if (0xffffff00 < blocksize - 0x100) {
    uVar1 = (ulong)blocksize;
    uVar2 = (uint)buf[uVar1 - 1];
    if (blocksize == 0) {
      bVar7 = true;
    }
    else {
      pbVar3 = buf + uVar1;
      uVar4 = 0;
      bVar5 = 0;
      uVar6 = 0;
      do {
        pbVar3 = pbVar3 + -1;
        uVar6 = uVar6 | ((uint)uVar4 ^ uVar2) - 1 >> 0x18;
        bVar5 = bVar5 | ~(byte)uVar6 & (*pbVar3 ^ buf[uVar1 - 1]);
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
      bVar7 = bVar5 == 0;
    }
    *unpadded_buflen_p = blocksize - uVar2;
    uVar2 = (uint)(byte)(uVar2 <= blocksize & bVar7);
  }
  return uVar2;
}

Assistant:

int CRYPTO_pkcs7_unpad(unsigned int *unpadded_buflen_p, unsigned char *buf, unsigned int blocksize)
{
    const unsigned char       *tail;
    unsigned char              mask = 0U;
    unsigned char              c;
    unsigned char              invalid = 0U;
    unsigned int               i;
    unsigned char              pad;

    if (blocksize <= 0U || blocksize >= 256U)
        return GML_ERROR;

    tail = &buf[blocksize - 1U];
    pad = *tail;

    for (i = 0U; i < blocksize; i++) {
        c = *(tail - i);
        mask |= (unsigned char) (((i ^ (unsigned int) pad) - 1U) >> ((sizeof(unsigned int) - 1) * 8));
        invalid |= (c ^ pad) & (~mask);
    }
    *unpadded_buflen_p = blocksize - (unsigned int) pad;

    return (int)(invalid == 0U && pad <= blocksize);
}